

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quicly.c
# Opt level: O0

void quicly_reset_stream(quicly_stream_t *stream,int err)

{
  int iVar1;
  uint in_ESI;
  undefined8 *in_RDI;
  quicly_stream_id_t in_stack_ffffffffffffffe8;
  int in_stack_fffffffffffffff0;
  
  quicly_is_client((quicly_conn_t *)*in_RDI);
  iVar1 = quicly_stream_has_send_side(in_stack_fffffffffffffff0,in_stack_ffffffffffffffe8);
  if (iVar1 == 0) {
    __assert_fail("quicly_stream_has_send_side(quicly_is_client(stream->conn), stream->stream_id)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/lib/quicly.c"
                  ,0x1738,"void quicly_reset_stream(quicly_stream_t *, int)");
  }
  if ((in_ESI & 0xffff0000) != 0x30000) {
    __assert_fail("QUICLY_ERROR_IS_QUIC_APPLICATION(err)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/lib/quicly.c"
                  ,0x1739,"void quicly_reset_stream(quicly_stream_t *, int)");
  }
  if (*(int *)(in_RDI + 0x1a) != 0) {
    __assert_fail("stream->_send_aux.reset_stream.sender_state == QUICLY_SENDER_STATE_NONE",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/lib/quicly.c"
                  ,0x173a,"void quicly_reset_stream(quicly_stream_t *, int)");
  }
  iVar1 = quicly_sendstate_transfer_complete((quicly_sendstate_t *)(in_RDI + 3));
  if (iVar1 == 0) {
    quicly_sendstate_reset((quicly_sendstate_t *)CONCAT44(in_ESI,in_stack_fffffffffffffff0));
    *(undefined4 *)(in_RDI + 0x1a) = 1;
    *(short *)((long)in_RDI + 0xd4) = (short)in_ESI;
    sched_stream_control((quicly_stream_t *)0x13e37e);
    resched_stream_data((quicly_stream_t *)CONCAT44(in_ESI,in_stack_fffffffffffffff0));
    return;
  }
  __assert_fail("!quicly_sendstate_transfer_complete(&stream->sendstate)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/lib/quicly.c"
                ,0x173b,"void quicly_reset_stream(quicly_stream_t *, int)");
}

Assistant:

void quicly_reset_stream(quicly_stream_t *stream, int err)
{
    assert(quicly_stream_has_send_side(quicly_is_client(stream->conn), stream->stream_id));
    assert(QUICLY_ERROR_IS_QUIC_APPLICATION(err));
    assert(stream->_send_aux.reset_stream.sender_state == QUICLY_SENDER_STATE_NONE);
    assert(!quicly_sendstate_transfer_complete(&stream->sendstate));

    /* dispose sendbuf state */
    quicly_sendstate_reset(&stream->sendstate);

    /* setup RESET_STREAM */
    stream->_send_aux.reset_stream.sender_state = QUICLY_SENDER_STATE_SEND;
    stream->_send_aux.reset_stream.error_code = QUICLY_ERROR_GET_ERROR_CODE(err);

    /* schedule for delivery */
    sched_stream_control(stream);
    resched_stream_data(stream);
}